

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t set_times(archive_write_disk *a,wchar_t fd,wchar_t mode,char *name,time_t atime,
                 long atime_nanos,time_t birthtime,long birthtime_nanos,time_t mtime,
                 long mtime_nanos,time_t cctime,long ctime_nanos)

{
  wchar_t wVar1;
  uint *puVar2;
  long in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  archive *in_RDI;
  time_t in_R8;
  wchar_t unaff_retaddr;
  wchar_t r2;
  wchar_t r1;
  wchar_t in_stack_fffffffffffffffc;
  
  wVar1 = set_time(unaff_retaddr,in_stack_fffffffffffffffc,(char *)in_RDI,CONCAT44(in_ESI,in_EDX),
                   in_RCX,in_R8,_r2);
  if (wVar1 == L'\0') {
    wVar1 = L'\0';
  }
  else {
    puVar2 = (uint *)__errno_location();
    archive_set_error(in_RDI,(int)(ulong)*puVar2,"Can\'t restore time");
    wVar1 = L'\xffffffec';
  }
  return wVar1;
}

Assistant:

static int
set_times(struct archive_write_disk *a,
    int fd, int mode, const char *name,
    time_t atime, long atime_nanos,
    time_t birthtime, long birthtime_nanos,
    time_t mtime, long mtime_nanos,
    time_t cctime, long ctime_nanos)
{
	/* Note: set_time doesn't use libarchive return conventions!
	 * It uses syscall conventions.  So 0 here instead of ARCHIVE_OK. */
	int r1 = 0, r2 = 0;

#ifdef F_SETTIMES
	 /*
	 * on Tru64 try own fcntl first which can restore even the
	 * ctime, fall back to default code path below if it fails
	 * or if we are not running as root
	 */
	if (a->user_uid == 0 &&
	    set_time_tru64(fd, mode, name,
			   atime, atime_nanos, mtime,
			   mtime_nanos, cctime, ctime_nanos) == 0) {
		return (ARCHIVE_OK);
	}
#else /* Tru64 */
	(void)cctime; /* UNUSED */
	(void)ctime_nanos; /* UNUSED */
#endif /* Tru64 */

#ifdef HAVE_STRUCT_STAT_ST_BIRTHTIME
	/*
	 * If you have struct stat.st_birthtime, we assume BSD
	 * birthtime semantics, in which {f,l,}utimes() updates
	 * birthtime to earliest mtime.  So we set the time twice,
	 * first using the birthtime, then using the mtime.  If
	 * birthtime == mtime, this isn't necessary, so we skip it.
	 * If birthtime > mtime, then this won't work, so we skip it.
	 */
	if (birthtime < mtime
	    || (birthtime == mtime && birthtime_nanos < mtime_nanos))
		r1 = set_time(fd, mode, name,
			      atime, atime_nanos,
			      birthtime, birthtime_nanos);
#else
	(void)birthtime; /* UNUSED */
	(void)birthtime_nanos; /* UNUSED */
#endif
	r2 = set_time(fd, mode, name,
		      atime, atime_nanos,
		      mtime, mtime_nanos);
	if (r1 != 0 || r2 != 0) {
		archive_set_error(&a->archive, errno,
				  "Can't restore time");
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}